

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_writer.cc
# Opt level: O1

void __thiscall FileWriter::writeHeader(FileWriter *this,File *file,string *path)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  value_t t;
  json_value jVar2;
  reference pvVar3;
  long *plVar4;
  pointer *ppbVar5;
  size_type *psVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> jsonPath;
  json jsonHeader;
  string local_80;
  value_t local_60;
  json_value local_58;
  lrit local_50 [8];
  json_value local_48 [8];
  string local_40;
  
  lrit::toJSON_abi_cxx11_(local_50,file);
  buildPath(&local_80,this,path);
  local_58.object = (object_t *)0x0;
  local_60 = string;
  local_58.object = (object_t *)operator_new(0x20);
  ppbVar5 = &((local_58.array)->
             super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
             )._M_impl.super__Vector_impl_data._M_end_of_storage;
  ((local_58.array)->
  super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)ppbVar5;
  paVar1 = &local_80.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p == paVar1) {
    *ppbVar5 = (pointer)local_80.field_2._M_allocated_capacity;
    local_58.array[1].
    super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)local_80.field_2._8_8_;
  }
  else {
    ((local_58.array)->
    super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)local_80._M_dataplus._M_p;
    ((local_58.array)->
    super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)local_80.field_2._M_allocated_capacity;
  }
  ((local_58.array)->
  super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)local_80._M_string_length;
  local_80._M_string_length = 0;
  local_80.field_2._M_allocated_capacity =
       local_80.field_2._M_allocated_capacity & 0xffffffffffffff00;
  local_80._M_dataplus._M_p = (pointer)paVar1;
  pvVar3 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       *)local_50,"Path");
  t = pvVar3->m_type;
  pvVar3->m_type = local_60;
  jVar2 = pvVar3->m_value;
  (pvVar3->m_value).array = (array_t *)local_58;
  local_60 = t;
  local_58 = jVar2;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::json_value::destroy((json_value *)&local_58.boolean,t);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != paVar1) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  removeSuffix(&local_40,path);
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_40);
  psVar6 = (size_type *)(plVar4 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar6) {
    local_80.field_2._M_allocated_capacity = *psVar6;
    local_80.field_2._8_8_ = plVar4[3];
    local_80._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_80.field_2._M_allocated_capacity = *psVar6;
    local_80._M_dataplus._M_p = (pointer)*plVar4;
  }
  local_80._M_string_length = plVar4[1];
  *plVar4 = (long)psVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  write(this,(int)&local_80,local_50,0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != paVar1) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::json_value::destroy(local_48,(value_t)local_50[0]);
  return;
}

Assistant:

void FileWriter::writeHeader(const lrit::File& file, const std::string& path) {
  auto jsonHeader = lrit::toJSON(file);
  jsonHeader["Path"] = buildPath(path);
  auto jsonPath = removeSuffix(path) + ".json";
  write(jsonPath, jsonHeader);
}